

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O1

void __thiscall CaDiCaL::Solver::section(Solver *this,char *title)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  External *this_00;
  int iVar8;
  char *in_RCX;
  char *fmt;
  char *fmt_00;
  Internal *pIVar9;
  Internal *this_01;
  Internal *this_02;
  __va_list_tag _Stack_1f0;
  undefined1 auStack_1d0 [192];
  Internal *pIStack_110;
  __va_list_tag _Stack_108;
  undefined1 auStack_e8 [176];
  Internal *pIStack_38;
  Solver *pSStack_30;
  undefined1 auStack_18 [8];
  
  if (this->_state == DELETING) {
    return;
  }
  pIVar9 = (Internal *)this;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)this,"void CaDiCaL::Solver::section(const char *)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,in_RCX);
  if (this->external == (External *)0x0) {
    section();
  }
  else {
    pIVar9 = this->internal;
    if (pIVar9 != (Internal *)0x0) {
      Internal::section(pIVar9,title);
      return;
    }
  }
  section();
  iVar8._0_1_ = pIVar9->unsat;
  iVar8._1_1_ = pIVar9->iterating;
  iVar8._2_1_ = pIVar9->localsearching;
  iVar8._3_1_ = pIVar9->lookingahead;
  if (iVar8 == 0x80) {
    return;
  }
  iVar8 = 0x9490ea;
  this_01 = pIVar9;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pIVar9,"void CaDiCaL::Solver::message()",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,in_RCX);
  lVar3._0_1_ = pIVar9->external_prop_is_lazy;
  lVar3._1_1_ = pIVar9->forced_backt_allowed;
  lVar3._2_1_ = pIVar9->private_steps;
  lVar3._3_1_ = pIVar9->rephased;
  lVar3._4_4_ = *(undefined4 *)&pIVar9->field_0x14;
  if (lVar3 == 0) {
    message();
  }
  else {
    this_01 = *(Internal **)&pIVar9->preprocessing;
    if (this_01 != (Internal *)0x0) {
      Internal::message(this_01);
      return;
    }
  }
  message();
  iVar1._0_1_ = this_01->unsat;
  iVar1._1_1_ = this_01->iterating;
  iVar1._2_1_ = this_01->localsearching;
  iVar1._3_1_ = this_01->lookingahead;
  if (iVar1 == 0x80) {
    return;
  }
  fmt_00 = "void CaDiCaL::Solver::verbose(int, const char *, ...)";
  pIStack_110 = (Internal *)0x860c59;
  this_02 = this_01;
  pIStack_38 = pIVar9;
  pSStack_30 = this;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)this_01,"void CaDiCaL::Solver::verbose(int, const char *, ...)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,in_RCX);
  lVar4._0_1_ = this_01->external_prop_is_lazy;
  lVar4._1_1_ = this_01->forced_backt_allowed;
  lVar4._2_1_ = this_01->private_steps;
  lVar4._3_1_ = this_01->rephased;
  lVar4._4_4_ = *(undefined4 *)&this_01->field_0x14;
  if (lVar4 == 0) {
    pIStack_110 = (Internal *)0x860cb2;
    verbose();
  }
  else {
    lVar5._0_1_ = this_01->preprocessing;
    lVar5._1_1_ = this_01->protected_reasons;
    lVar5._2_1_ = this_01->force_saved_phase;
    lVar5._3_1_ = this_01->searching_lucky_phases;
    lVar5._4_1_ = this_01->stable;
    lVar5._5_1_ = this_01->reported;
    lVar5._6_1_ = this_01->external_prop;
    lVar5._7_1_ = this_01->did_external_prop;
    if (lVar5 != 0) {
      if ((this_01->unsat & 0x7eU) != 0) {
        _Stack_108.reg_save_area = auStack_e8;
        _Stack_108.gp_offset = 0x18;
        _Stack_108.fp_offset = 0x30;
        pIStack_110 = (Internal *)0x860ca1;
        _Stack_108.overflow_arg_area = auStack_18;
        Internal::vverbose(*(Internal **)&this_01->preprocessing,iVar8,fmt,(va_list *)&_Stack_108);
        return;
      }
      goto LAB_00860cb7;
    }
  }
  pIStack_110 = (Internal *)0x860cb7;
  verbose();
LAB_00860cb7:
  pIStack_110 = (Internal *)error;
  verbose();
  iVar2._0_1_ = this_02->unsat;
  iVar2._1_1_ = this_02->iterating;
  iVar2._2_1_ = this_02->localsearching;
  iVar2._3_1_ = this_02->lookingahead;
  if (iVar2 == 0x80) {
    return;
  }
  pIVar9 = this_02;
  pIStack_110 = this_01;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)this_02,"void CaDiCaL::Solver::error(const char *, ...)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,in_RCX);
  lVar6._0_1_ = this_02->external_prop_is_lazy;
  lVar6._1_1_ = this_02->forced_backt_allowed;
  lVar6._2_1_ = this_02->private_steps;
  lVar6._3_1_ = this_02->rephased;
  lVar6._4_4_ = *(undefined4 *)&this_02->field_0x14;
  if (lVar6 == 0) {
    error();
  }
  else {
    lVar7._0_1_ = this_02->preprocessing;
    lVar7._1_1_ = this_02->protected_reasons;
    lVar7._2_1_ = this_02->force_saved_phase;
    lVar7._3_1_ = this_02->searching_lucky_phases;
    lVar7._4_1_ = this_02->stable;
    lVar7._5_1_ = this_02->reported;
    lVar7._6_1_ = this_02->external_prop;
    lVar7._7_1_ = this_02->did_external_prop;
    if (lVar7 != 0) {
      _Stack_1f0.reg_save_area = auStack_1d0;
      _Stack_1f0.overflow_arg_area = &_Stack_108.overflow_arg_area;
      _Stack_1f0.gp_offset = 0x10;
      _Stack_1f0.fp_offset = 0x30;
      Internal::verror(*(Internal **)&this_02->preprocessing,fmt_00,(va_list *)&_Stack_1f0);
      return;
    }
  }
  error();
  this_00 = *(External **)pIVar9;
  if (this_00 == (External *)0x0) {
    return;
  }
  External::~External(this_00);
  operator_delete(this_00,0x238);
  return;
}

Assistant:

void Solver::section (const char *title) {
  if (state () == DELETING)
    return;
#ifdef QUIET
  (void) title;
#endif
  REQUIRE_INITIALIZED ();
  SECTION (title);
}